

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SolidShapes.cpp
# Opt level: O0

string * __thiscall iDynTree::Material::name_abi_cxx11_(Material *this)

{
  long in_RSI;
  string *in_RDI;
  
  std::__cxx11::string::string((string *)in_RDI,(string *)(in_RSI + 0x48));
  return in_RDI;
}

Assistant:

std::string Material::name() const { return m_name; }